

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O0

void __thiscall CHuffman::Setbits_r(CHuffman *this,CNode *pNode,int Bits,uint Depth)

{
  uint in_ECX;
  uint in_EDX;
  CHuffman *in_RSI;
  undefined8 in_RDI;
  
  if (in_RSI->m_aNodes[0].m_aLeafs[1] != 0xffff) {
    Setbits_r(in_RSI,(CNode *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (in_RSI->m_aNodes[0].m_aLeafs[0] != 0xffff) {
    Setbits_r(in_RSI,(CNode *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (in_RSI->m_aNodes[0].m_NumBits != 0) {
    in_RSI->m_aNodes[0].m_Bits = in_EDX;
    in_RSI->m_aNodes[0].m_NumBits = in_ECX;
  }
  return;
}

Assistant:

void CHuffman::Setbits_r(CNode *pNode, int Bits, unsigned Depth)
{
	if(pNode->m_aLeafs[1] != 0xffff)
		Setbits_r(&m_aNodes[pNode->m_aLeafs[1]], Bits|(1<<Depth), Depth+1);
	if(pNode->m_aLeafs[0] != 0xffff)
		Setbits_r(&m_aNodes[pNode->m_aLeafs[0]], Bits, Depth+1);

	if(pNode->m_NumBits)
	{
		pNode->m_Bits = Bits;
		pNode->m_NumBits = Depth;
	}
}